

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles31::Functional::createDrawBuffersIndexedTests(Context *context)

{
  TestCaseGroup *this;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  TestCaseGroup *this_03;
  TestCaseGroup *this_04;
  TestCaseGroup *maxImplGroup;
  TestCaseGroup *maxGroup;
  TestCaseGroup *randomGroup;
  TestCaseGroup *postGroup;
  TestCaseGroup *preGroup;
  TestCaseGroup *group;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_e0;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_a8;
  Maybe<bool> local_88;
  undefined1 local_78 [8];
  BlendState emptyState;
  Context *context_local;
  
  emptyState.colorMask.field_1 = (anon_union_8_2_d0736028_for_Maybe<tcu::Vector<bool,_4>_>_2)context
  ;
  tcu::Maybe<bool>::Maybe(&local_88);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_a8);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_e0);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe((Maybe<tcu::Vector<bool,_4>_> *)&group);
  anon_unknown_0::BlendState::BlendState
            ((BlendState *)local_78,&local_88,&local_a8,&local_e0,
             (Maybe<tcu::Vector<bool,_4>_> *)&group);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe((Maybe<tcu::Vector<bool,_4>_> *)&group);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_e0);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_a8);
  tcu::Maybe<bool>::~Maybe(&local_88);
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this,(Context *)emptyState.colorMask.field_1,"draw_buffers_indexed",
             "Test for indexed draw buffers. GL_EXT_draw_buffers_indexed.");
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(Context *)emptyState.colorMask.field_1,"overwrite_common",
             "Set common state and overwrite it with draw buffer blend state.");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(Context *)emptyState.colorMask.field_1,"overwrite_indexed",
             "Set indexed blend state and overwrite it with common state.");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,(Context *)emptyState.colorMask.field_1,"random",
             "Random indexed blend state tests.");
  this_03 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_03,(Context *)emptyState.colorMask.field_1,"max_required_draw_buffers",
             "Random tests using minimum maximum number of draw buffers.");
  this_04 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_04,(Context *)emptyState.colorMask.field_1,"max_implementation_draw_buffers",
             "Random tests using maximum number of draw buffers reported by implementation.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)this_03);
  tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)this_04);
  anon_unknown_0::addDrawBufferCommonTests(this_00,PRE);
  anon_unknown_0::addDrawBufferCommonTests(this_01,POST);
  anon_unknown_0::addRandomMaxTest(this_03);
  anon_unknown_0::addRandomImplMaxTest(this_04);
  anon_unknown_0::BlendState::~BlendState((BlendState *)local_78);
  return this;
}

Assistant:

TestCaseGroup* createDrawBuffersIndexedTests (Context& context)
{
	const BlendState		emptyState		= BlendState(Maybe<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
	TestCaseGroup* const	group			= new TestCaseGroup(context, "draw_buffers_indexed", "Test for indexed draw buffers. GL_EXT_draw_buffers_indexed.");

	TestCaseGroup* const	preGroup		= new TestCaseGroup(context, "overwrite_common", "Set common state and overwrite it with draw buffer blend state.");
	TestCaseGroup* const	postGroup		= new TestCaseGroup(context, "overwrite_indexed", "Set indexed blend state and overwrite it with common state.");
	TestCaseGroup* const	randomGroup		= new TestCaseGroup(context, "random", "Random indexed blend state tests.");
	TestCaseGroup* const	maxGroup		= new TestCaseGroup(context, "max_required_draw_buffers", "Random tests using minimum maximum number of draw buffers.");
	TestCaseGroup* const	maxImplGroup	= new TestCaseGroup(context, "max_implementation_draw_buffers", "Random tests using maximum number of draw buffers reported by implementation.");

	group->addChild(preGroup);
	group->addChild(postGroup);
	group->addChild(randomGroup);

	randomGroup->addChild(maxGroup);
	randomGroup->addChild(maxImplGroup);

	addDrawBufferCommonTests(preGroup, PRE);
	addDrawBufferCommonTests(postGroup, POST);
	addRandomMaxTest(maxGroup);
	addRandomImplMaxTest(maxImplGroup);

	return group;
}